

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SpecparamDeclaratorSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SpecparamDeclaratorSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax *args_3,
          Token *args_4,ExpressionSyntax **args_5,Token *args_6)

{
  ExpressionSyntax *pEVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TokenKind TVar15;
  undefined1 uVar16;
  NumericTokenFlags NVar17;
  uint32_t uVar18;
  TokenKind TVar19;
  undefined1 uVar20;
  NumericTokenFlags NVar21;
  uint32_t uVar22;
  TokenKind TVar23;
  undefined1 uVar24;
  NumericTokenFlags NVar25;
  uint32_t uVar26;
  SpecparamDeclaratorSyntax *pSVar27;
  
  pSVar27 = (SpecparamDeclaratorSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SpecparamDeclaratorSyntax *)this->endPtr < pSVar27 + 1) {
    pSVar27 = (SpecparamDeclaratorSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pSVar27 + 1);
  }
  TVar7 = args->kind;
  uVar8 = args->field_0x2;
  NVar9.raw = (args->numFlags).raw;
  uVar10 = args->rawLen;
  pIVar2 = args->info;
  TVar11 = args_1->kind;
  uVar12 = args_1->field_0x2;
  NVar13.raw = (args_1->numFlags).raw;
  uVar14 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar15 = args_2->kind;
  uVar16 = args_2->field_0x2;
  NVar17.raw = (args_2->numFlags).raw;
  uVar18 = args_2->rawLen;
  pIVar4 = args_2->info;
  TVar19 = args_4->kind;
  uVar20 = args_4->field_0x2;
  NVar21.raw = (args_4->numFlags).raw;
  uVar22 = args_4->rawLen;
  pIVar5 = args_4->info;
  pEVar1 = *args_5;
  TVar23 = args_6->kind;
  uVar24 = args_6->field_0x2;
  NVar25.raw = (args_6->numFlags).raw;
  uVar26 = args_6->rawLen;
  pIVar6 = args_6->info;
  (pSVar27->super_SyntaxNode).kind = SpecparamDeclarator;
  (pSVar27->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pSVar27->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pSVar27->name).kind = TVar7;
  (pSVar27->name).field_0x2 = uVar8;
  (pSVar27->name).numFlags = (NumericTokenFlags)NVar9.raw;
  (pSVar27->name).rawLen = uVar10;
  (pSVar27->name).info = pIVar2;
  (pSVar27->equals).kind = TVar11;
  (pSVar27->equals).field_0x2 = uVar12;
  (pSVar27->equals).numFlags = (NumericTokenFlags)NVar13.raw;
  (pSVar27->equals).rawLen = uVar14;
  (pSVar27->equals).info = pIVar3;
  (pSVar27->openParen).kind = TVar15;
  (pSVar27->openParen).field_0x2 = uVar16;
  (pSVar27->openParen).numFlags = (NumericTokenFlags)NVar17.raw;
  (pSVar27->openParen).rawLen = uVar18;
  (pSVar27->openParen).info = pIVar4;
  (pSVar27->value1).ptr = args_3;
  (pSVar27->comma).kind = TVar19;
  (pSVar27->comma).field_0x2 = uVar20;
  (pSVar27->comma).numFlags = (NumericTokenFlags)NVar21.raw;
  (pSVar27->comma).rawLen = uVar22;
  (pSVar27->comma).info = pIVar5;
  pSVar27->value2 = pEVar1;
  (pSVar27->closeParen).kind = TVar23;
  (pSVar27->closeParen).field_0x2 = uVar24;
  (pSVar27->closeParen).numFlags = (NumericTokenFlags)NVar25.raw;
  (pSVar27->closeParen).rawLen = uVar26;
  (pSVar27->closeParen).info = pIVar6;
  (args_3->super_SyntaxNode).parent = &pSVar27->super_SyntaxNode;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = &pSVar27->super_SyntaxNode;
  }
  return pSVar27;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }